

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh.c
# Opt level: O3

void ssh_closing(Plug *plug,PlugCloseType type,char *error_msg)

{
  PlugVtable *pPVar1;
  
  if (type == PLUGCLOSE_NORMAL) {
    pPVar1 = plug[0x32].vt;
    if (pPVar1 != (PlugVtable *)0x0) {
      *(undefined1 *)&pPVar1->sent = 1;
      queue_idempotent_callback((IdempotentCallback *)&pPVar1[4].closing);
      return;
    }
    return;
  }
  if (type == PLUGCLOSE_USER_ABORT) {
    ssh_user_close((Ssh *)(plug + -5),"%s");
    return;
  }
  ssh_remote_error((Ssh *)(plug + -5),"%s");
  return;
}

Assistant:

static void ssh_closing(Plug *plug, PlugCloseType type, const char *error_msg)
{
    Ssh *ssh = container_of(plug, Ssh, plug);
    if (type == PLUGCLOSE_USER_ABORT) {
        ssh_user_close(ssh, "%s", error_msg);
    } else if (type != PLUGCLOSE_NORMAL) {
        ssh_remote_error(ssh, "%s", error_msg);
    } else if (ssh->bpp) {
        ssh->bpp->input_eof = true;
        queue_idempotent_callback(&ssh->bpp->ic_in_raw);
    }
}